

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  string local_208;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_1e8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_1c8;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_1a8;
  Environment env;
  RefBase<vk::Handle<(vk::HandleType)23>_> local_148;
  Resources res;
  
  Environment::Environment(&env,(Context *)this,4);
  Framebuffer::Resources::Resources(&res,&env,extraout_RDX);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_1e8,&env,&res,param_4);
  local_208.field_2._M_allocated_capacity = (size_type)local_1e8.m_data.deleter.m_device;
  local_208.field_2._8_8_ = local_1e8.m_data.deleter.m_allocator;
  local_208._M_dataplus._M_p = (pointer)local_1e8.m_data.object.m_internal;
  local_208._M_string_length = (size_type)local_1e8.m_data.deleter.m_deviceIface;
  local_1e8.m_data.object.m_internal = 0;
  local_1e8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1e8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1e8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1e8);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_1c8,&env,&res,param_4);
  local_1e8.m_data.deleter.m_device = local_1c8.m_data.deleter.m_device;
  local_1e8.m_data.deleter.m_allocator = local_1c8.m_data.deleter.m_allocator;
  local_1e8.m_data.object.m_internal = local_1c8.m_data.object.m_internal;
  local_1e8.m_data.deleter.m_deviceIface = local_1c8.m_data.deleter.m_deviceIface;
  local_1c8.m_data.object.m_internal = 0;
  local_1c8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1c8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1c8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1c8);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_1a8,&env,&res,param_4);
  local_1c8.m_data.deleter.m_device = local_1a8.m_data.deleter.m_device;
  local_1c8.m_data.deleter.m_allocator = local_1a8.m_data.deleter.m_allocator;
  local_1c8.m_data.object.m_internal = local_1a8.m_data.object.m_internal;
  local_1c8.m_data.deleter.m_deviceIface = local_1a8.m_data.deleter.m_deviceIface;
  local_1a8.m_data.object.m_internal = 0;
  local_1a8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_1a8.m_data.deleter.m_device = (VkDevice)0x0;
  local_1a8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1a8);
  Framebuffer::create((Move<vk::Handle<(vk::HandleType)23>_> *)&local_148,&env,&res,param_4);
  local_1a8.m_data.deleter.m_device = local_148.m_data.deleter.m_device;
  local_1a8.m_data.deleter.m_allocator = local_148.m_data.deleter.m_allocator;
  local_1a8.m_data.object.m_internal = local_148.m_data.object.m_internal;
  local_1a8.m_data.deleter.m_deviceIface = local_148.m_data.deleter.m_deviceIface;
  local_148.m_data.object.m_internal = 0;
  local_148.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_148.m_data.deleter.m_device = (VkDevice)0x0;
  local_148.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_148);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1a8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1c8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase(&local_1e8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)23>_> *)&local_208);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Ok",(allocator<char> *)&local_1e8);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  Framebuffer::Resources::~Resources(&res);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}